

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall
MT32Emu::RendererImpl<float>::doRender(RendererImpl<float> *this,float *stereoStream,Bit32u len)

{
  Bit32u *pBVar1;
  Synth *pSVar2;
  Analog *pAVar3;
  Bit32u len_00;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)len;
  pSVar2 = (this->super_Renderer).synth;
  if (pSVar2->activated != true) {
    iVar4 = (*pSVar2->analog->_vptr_Analog[3])();
    pSVar2 = (this->super_Renderer).synth;
    pBVar1 = &pSVar2->renderedSampleCount;
    *pBVar1 = *pBVar1 + iVar4;
    pAVar3 = pSVar2->analog;
    iVar4 = (*pAVar3->_vptr_Analog[7])(pAVar3,0,0,0,0,0,0,stereoStream,uVar7);
    if ((char)iVar4 == '\0') {
      Synth::printDebug((this->super_Renderer).synth,"%s",
                        "RendererImpl: Invalid call to Analog::process()!\n");
    }
    if (len * 2 != 0 && stereoStream != (float *)0x0) {
      memset(stereoStream,0,(ulong)(len * 2) << 2);
    }
    Renderer::updateDisplayState(&this->super_Renderer);
    return;
  }
  do {
    uVar6 = (uint)uVar7;
    if (uVar6 == 0) {
      return;
    }
    uVar5 = 0x1000;
    if (uVar6 < 0x1000) {
      uVar5 = uVar7;
    }
    pAVar3 = ((this->super_Renderer).synth)->analog;
    len_00 = (*pAVar3->_vptr_Analog[3])(pAVar3,uVar5);
    doRenderStreams(this,&this->tmpBuffers,len_00);
    pAVar3 = ((this->super_Renderer).synth)->analog;
    iVar4 = (*pAVar3->_vptr_Analog[7])
                      (pAVar3,stereoStream,this->tmpNonReverbLeft,this->tmpNonReverbRight,
                       this->tmpReverbDryLeft,this->tmpReverbDryRight,this->tmpReverbWetLeft,
                       this->tmpReverbWetRight,uVar5);
    if ((char)iVar4 == '\0') {
      Synth::printDebug((this->super_Renderer).synth,"%s",
                        "RendererImpl: Invalid call to Analog::process()!\n");
      if ((stereoStream != (float *)0x0) && (uVar6 * 2 != 0)) {
        memset(stereoStream,0,(ulong)(uVar6 * 2) << 2);
      }
    }
    else {
      stereoStream = stereoStream + (uint)((int)uVar5 * 2);
      uVar7 = (ulong)(uVar6 - (int)uVar5);
    }
  } while ((char)iVar4 != '\0');
  return;
}

Assistant:

void RendererImpl<Sample>::doRender(Sample *stereoStream, Bit32u len) {
	if (!isActivated()) {
		incRenderedSampleCount(getAnalog().getDACStreamsLength(len));
		if (!getAnalog().process(NULL, NULL, NULL, NULL, NULL, NULL, stereoStream, len)) {
			printDebug("RendererImpl: Invalid call to Analog::process()!\n");
		}
		Synth::muteSampleBuffer(stereoStream, len << 1);
		updateDisplayState();
		return;
	}

	while (len > 0) {
		// As in AnalogOutputMode_ACCURATE mode output is upsampled, MAX_SAMPLES_PER_RUN is more than enough for the temp buffers.
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(tmpBuffers, getAnalog().getDACStreamsLength(thisPassLen));
		if (!getAnalog().process(stereoStream, tmpNonReverbLeft, tmpNonReverbRight, tmpReverbDryLeft, tmpReverbDryRight, tmpReverbWetLeft, tmpReverbWetRight, thisPassLen)) {
			printDebug("RendererImpl: Invalid call to Analog::process()!\n");
			Synth::muteSampleBuffer(stereoStream, len << 1);
			return;
		}
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}